

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

Lit __thiscall Minisat::SimpSolver::subsumes(SimpSolver *this,Clause *c1,Clause *c2)

{
  int iVar1;
  unsigned_long *puVar2;
  int iVar3;
  ulong uVar4;
  uint64_t uVar5;
  ulong uVar6;
  
  uVar4 = (ulong)c1->header >> 0x22;
  uVar6 = (ulong)c2->header >> 0x22;
  iVar3 = -1;
  if ((uVar4 <= uVar6) &&
     ((*(uint *)(&c1[1].header.field_0x0 + uVar4 * 4) &
      ~*(uint *)(&c2[1].header.field_0x0 + uVar6 * 4)) == 0)) {
    uVar5 = (this->super_Solver).counter + 1;
    (this->super_Solver).counter = uVar5;
    if ((ulong)c2->header >> 0x22 != 0) {
      puVar2 = (this->super_Solver).seen2.data;
      uVar4 = 0;
      do {
        puVar2[*(int *)(&c2[1].header.field_0x0 + uVar4 * 4)] = uVar5;
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)c2->header >> 0x22);
    }
    iVar3 = -2;
    if (0x3ffffffff < (ulong)c1->header) {
      puVar2 = (this->super_Solver).seen2.data;
      iVar3 = -2;
      uVar4 = 0;
      do {
        iVar1 = *(int *)(&c1[1].header.field_0x0 + uVar4 * 4);
        if ((puVar2[iVar1] != uVar5) &&
           ((iVar3 != -2 || (iVar3 = iVar1, puVar2[(long)iVar1 ^ 1] != uVar5)))) {
          iVar3 = -1;
        }
        uVar4 = uVar4 + 1;
      } while ((ulong)c1->header >> 0x22 != uVar4);
    }
  }
  return (Lit)iVar3;
}

Assistant:

int size() const { return header.size; }